

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDStats.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMDRTheta::processFrame(RNEMDRTheta *this,int istep)

{
  RNEMDRTheta *pRVar1;
  bool bVar2;
  SquareMatrix3<double> *this_00;
  double *pdVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  pointer pBVar8;
  Vector<double,_3U> *v;
  reference pvVar9;
  long in_RDI;
  ShellStatistics *pSVar10;
  Vector3d omega;
  int j;
  vector<double,_std::allocator<double>_> projections;
  RealType r;
  uint i_2;
  RealType r2;
  Mat3x3d I;
  Vector3d L;
  RealType m;
  Vector3d vel;
  Vector3d rPos;
  pair<int,_int> bins;
  size_t i_1;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  binL;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  binI;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binCount;
  int i;
  StuntDouble *sd;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffbb8;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffbc0;
  StuntDouble *in_stack_fffffffffffffbc8;
  Vector<double,_3U> *v2;
  SelectionManager *in_stack_fffffffffffffbd0;
  RNEMDRTheta *in_stack_fffffffffffffbd8;
  ShellStatistics *in_stack_fffffffffffffbe0;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffbe8;
  SelectionEvaluator *in_stack_fffffffffffffbf8;
  Vector3d *in_stack_fffffffffffffc00;
  RNEMDRTheta *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc18;
  ShellStatistics *in_stack_fffffffffffffc20;
  double local_310;
  Vector<double,_3U> local_308 [2];
  int local_2d8;
  undefined1 local_2d1 [25];
  double local_2b8;
  uint local_2ac;
  ShellStatistics *local_2a8;
  RectMatrix<double,_3U,_3U> local_258 [2];
  RectMatrix<double,_3U,_3U> local_1c8 [2];
  RNEMDRTheta *local_138;
  pair<int,_int> local_b8;
  ulong local_b0;
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  local_a0;
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  SelectionManager *local_40;
  
  ShellStatistics::processFrame
            (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
  bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xf8));
  if (bVar2) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffbf8);
    SelectionManager::setSelectionSet
              (in_stack_fffffffffffffbd0,(SelectionSet *)in_stack_fffffffffffffbc8);
    SelectionSet::~SelectionSet((SelectionSet *)0x1ae998);
  }
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1ae9e8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8,
           (allocator_type *)in_stack_fffffffffffffbd0);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1aea14);
  this_00 = (SquareMatrix3<double> *)(ulong)*(uint *)(in_RDI + 0x34);
  std::
  allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
  ::allocator((allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
               *)0x1aea3c);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::vector((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8,
           (allocator_type *)in_stack_fffffffffffffbd0);
  std::
  allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
  ::~allocator((allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>
                *)0x1aea68);
  std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>::
  allocator((allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
             *)0x1aea90);
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::vector((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
            *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8,
           (allocator_type *)in_stack_fffffffffffffbd0);
  std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>::
  ~allocator((allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
              *)0x1aeabc);
  for (local_b0 = 0; local_b0 < *(uint *)(in_RDI + 0x34); local_b0 = local_b0 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_60,local_b0);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0,
               (size_type)in_stack_fffffffffffffbd8);
    std::
    vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
    ::operator[](&local_80,local_b0);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    resize((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *
           )in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
    std::
    vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
    ::operator[](&local_a0,local_b0);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
  }
  local_40 = (SelectionManager *)
             SelectionManager::beginSelected
                       (in_stack_fffffffffffffbd0,(int *)in_stack_fffffffffffffbc8);
  while (local_40 != (SelectionManager *)0x0) {
    StuntDouble::getPos(in_stack_fffffffffffffbc8);
    local_b8 = getBins(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    if ((((-1 < local_b8.first) && (local_b8.first < *(int *)(in_RDI + 0x34))) &&
        (-1 < (long)local_b8)) && (local_b8.second < *(int *)(in_RDI + 0xd68))) {
      StuntDouble::getPos(in_stack_fffffffffffffbc8);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbc8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffbc0);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffbc0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffbb8);
      StuntDouble::getVel(in_stack_fffffffffffffbc8);
      local_138 = (RNEMDRTheta *)StuntDouble::getMass((StuntDouble *)local_40);
      cross<double>((Vector3<double> *)local_138,(Vector3<double> *)in_stack_fffffffffffffc20);
      OpenMD::operator*((double)in_stack_fffffffffffffbc8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffbc0);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffbc0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffbb8);
      SquareMatrix3<double>::SquareMatrix3
                ((SquareMatrix3<double> *)in_stack_fffffffffffffbc0,
                 (double)in_stack_fffffffffffffbb8);
      outProduct<double>((Vector3<double> *)in_stack_fffffffffffffbe8,
                         (Vector3<double> *)in_stack_fffffffffffffbe0);
      OpenMD::operator*(in_stack_fffffffffffffbe8,(double)in_stack_fffffffffffffbe0);
      SquareMatrix<double,_3>::SquareMatrix
                ((SquareMatrix<double,_3> *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)in_stack_fffffffffffffbc8,
                 (SquareMatrix<double,_3> *)in_stack_fffffffffffffbc0);
      SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x1aee66);
      RectMatrix<double,_3U,_3U>::~RectMatrix(local_258);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1aee80);
      pSVar10 = (ShellStatistics *)Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x1aee8d);
      in_stack_fffffffffffffc08 = local_138;
      in_stack_fffffffffffffc20 = pSVar10;
      local_2a8 = pSVar10;
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1c8,0,0);
      pRVar1 = local_138;
      *pdVar3 = (double)in_stack_fffffffffffffc08 * (double)pSVar10 + *pdVar3;
      pSVar10 = local_2a8;
      in_stack_fffffffffffffc00 = (Vector3d *)RectMatrix<double,_3U,_3U>::operator()(local_1c8,1,1);
      (in_stack_fffffffffffffc00->super_Vector<double,_3U>).data_[0] =
           (double)pRVar1 * (double)pSVar10 +
           (in_stack_fffffffffffffc00->super_Vector<double,_3U>).data_[0];
      in_stack_fffffffffffffbd8 = local_138;
      in_stack_fffffffffffffbe0 = local_2a8;
      in_stack_fffffffffffffbe8 =
           (RectMatrix<double,_3U,_3U> *)RectMatrix<double,_3U,_3U>::operator()(local_1c8,2,2);
      ((Vector<double,_3U> *)in_stack_fffffffffffffbe8->data_)->data_[0] =
           (double)in_stack_fffffffffffffbd8 * (double)in_stack_fffffffffffffbe0 +
           ((Vector<double,_3U> *)in_stack_fffffffffffffbe8->data_)->data_[0];
      pvVar4 = std::
               vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
               ::operator[](&local_80,(long)local_b8.first);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[](pvVar4,(long)local_b8.second);
      RectMatrix<double,_3U,_3U>::operator+=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      pvVar5 = std::
               vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
               ::operator[](&local_a0,(long)local_b8.first);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (pvVar5,(long)local_b8.second);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffbc0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffbb8);
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&local_60,(long)local_b8.first);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_b8.second);
      *pvVar7 = *pvVar7 + 1;
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1af056);
    }
    in_stack_fffffffffffffbd0 =
         (SelectionManager *)
         SelectionManager::nextSelected(in_stack_fffffffffffffbd0,(int *)in_stack_fffffffffffffbc8);
    local_40 = in_stack_fffffffffffffbd0;
  }
  for (local_2ac = 0; local_2ac < *(uint *)(in_RDI + 0x34); local_2ac = local_2ac + 1) {
    local_2b8 = ((double)local_2ac + 0.5) * *(double *)(in_RDI + 0x728);
    std::
    vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
    ::operator[]((vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                  *)(in_RDI + 0xdd0),(ulong)local_2ac);
    pBVar8 = std::
             unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
             ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                           *)0x1af198);
    (*pBVar8->_vptr_BaseAccumulator[2])(local_2b8);
    v = (Vector<double,_3U> *)(long)*(int *)(in_RDI + 0xd68);
    v2 = (Vector<double,_3U> *)local_2d1;
    std::allocator<double>::allocator((allocator<double> *)0x1af1d5);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbe0,
               (size_type)in_stack_fffffffffffffbd8,(allocator_type *)in_stack_fffffffffffffbd0);
    std::allocator<double>::~allocator((allocator<double> *)0x1af1fb);
    for (local_2d8 = 0; local_2d8 < *(int *)(in_RDI + 0xd68); local_2d8 = local_2d8 + 1) {
      local_310 = 0.0;
      Vector<double,_3U>::Vector(local_308,&local_310);
      Vector3<double>::Vector3((Vector3<double> *)v,(Vector<double,_3U> *)in_stack_fffffffffffffbb8)
      ;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&local_60,(ulong)local_2ac);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_2d8);
      if (0 < *pvVar7) {
        pvVar4 = std::
                 vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                 ::operator[](&local_80,(ulong)local_2ac);
        std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
        ::operator[](pvVar4,(long)local_2d8);
        SquareMatrix3<double>::inverse(this_00);
        pvVar5 = std::
                 vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                 ::operator[](&local_a0,(ulong)local_2ac);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (pvVar5,(long)local_2d8);
        OpenMD::operator*(in_stack_fffffffffffffbe8,(Vector<double,_3U> *)in_stack_fffffffffffffbe0)
        ;
        Vector3<double>::operator=((Vector3<double> *)v2,v);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1af326);
      }
      in_stack_fffffffffffffbb8 =
           (RectMatrix<double,_3U,_3U> *)
           dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffbd0,v2);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_2d1 + 1),(long)local_2d8
                         );
      *pvVar9 = (value_type)in_stack_fffffffffffffbb8;
    }
    std::
    vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
    ::operator[]((vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                  *)(in_RDI + 0xe30),(ulong)local_2ac);
    pBVar8 = std::
             unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
             ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                           *)0x1af409);
    (*pBVar8->_vptr_BaseAccumulator[3])(pBVar8,local_2d1 + 1);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbd0);
  }
  std::
  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
  ::~vector((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             *)in_stack_fffffffffffffbd0);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::~vector((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
             *)in_stack_fffffffffffffbd0);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffbd0);
  return;
}

Assistant:

void RNEMDRTheta::processFrame(int istep) {
    ShellStatistics::processFrame(istep);

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    StuntDouble* sd;
    int i;

    std::vector<std::vector<int>> binCount(nBins_);
    std::vector<std::vector<Mat3x3d>> binI(nBins_);
    std::vector<std::vector<Vector3d>> binL(nBins_);

    for (std::size_t i {}; i < nBins_; ++i) {
      binCount[i].resize(nAngleBins_);
      binI[i].resize(nAngleBins_);
      binL[i].resize(nAngleBins_);
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      std::pair<int, int> bins = getBins(sd->getPos());

      if (bins.first >= 0 && bins.first < int(nBins_)) {
        if (bins.second >= 0 && bins.second < nAngleBins_) {
          Vector3d rPos = sd->getPos() - coordinateOrigin_;
          Vector3d vel  = sd->getVel();
          RealType m    = sd->getMass();
          Vector3d L    = m * cross(rPos, vel);
          Mat3x3d I(0.0);
          I           = outProduct(rPos, rPos) * m;
          RealType r2 = rPos.lengthSquare();
          I(0, 0) += m * r2;
          I(1, 1) += m * r2;
          I(2, 2) += m * r2;

          binI[bins.first][bins.second] += I;
          binL[bins.first][bins.second] += L;
          binCount[bins.first][bins.second]++;
        }
      }
    }

    for (unsigned int i = 0; i < nBins_; i++) {
      RealType r = (((RealType)i + 0.5) * binWidth_);
      r_.accumulator[i]->add(r);

      std::vector<RealType> projections(nAngleBins_);

      for (int j = 0; j < nAngleBins_; j++) {
        Vector3d omega(0.0);

        if (binCount[i][j] > 0) { omega = binI[i][j].inverse() * binL[i][j]; }

        // RealType omegaProj = dot(omega, fluxVector_);
        projections[j] = dot(omega, fluxVector_);
      }

      angularVelocity_.accumulator[i]->add(projections);
    }
  }